

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_test_interface.h
# Opt level: O2

void __thiscall
google::
HashtableInterface_DenseHashtable<int,int,kEmptyInt,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
::HashtableInterface_DenseHashtable<int_const*>
          (HashtableInterface_DenseHashtable<int,int,kEmptyInt,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
           *this,int *f,int *l,size_type expected_max_items,hasher *hf,key_equal *eql,
          allocator_type *alloc)

{
  SetKey<int,_Negation<int>_> local_22;
  Negation<int> local_21;
  
  BaseHashtableInterface<google::dense_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
  ::BaseHashtableInterface<Negation<int>,SetKey<int,Negation<int>>>
            ((BaseHashtableInterface<google::dense_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>>
              *)this,expected_max_items,hf,eql,&local_21,&local_22,alloc);
  *(undefined ***)this = &PTR__BaseHashtableInterface_00bb6c18;
  dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::set_empty_key((dense_hashtable<int,_int,_Hasher,_Negation<int>,_SetKey<int,_Negation<int>_>,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
                   *)(this + 8),&kEmptyInt);
  dense_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
  ::insert<int_const*>
            ((dense_hashtable<int,int,Hasher,Negation<int>,SetKey<int,Negation<int>>,Hasher,Alloc<int,unsigned_long,18446744073709551615ul>>
              *)(this + 8),f,l);
  return;
}

Assistant:

HashtableInterface_DenseHashtable(
      InputIterator f, InputIterator l,
      typename p::size_type expected_max_items = 0,
      const typename p::hasher& hf = typename p::hasher(),
      const typename p::key_equal& eql = typename p::key_equal(),
      const typename p::allocator_type& alloc = typename p::allocator_type())
      : BaseHashtableInterface<ht>(expected_max_items, hf, eql, ExtractKey(),
                                   SetKey(), alloc) {
    this->set_empty_key(EMPTY_KEY);
    this->insert(f, l);
  }